

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O1

void __thiscall CHud::RenderScoreHud(CHud *this)

{
  CTextureHandle CVar1;
  undefined4 uVar2;
  uint uVar3;
  anon_union_4_2_94730227_for_vector4_base<float>_1 aVar4;
  float ID;
  CGameClient *pCVar5;
  anon_union_4_2_94730284_for_vector2_base<float>_1 *paVar6;
  CNetObj_GameDataFlag *pCVar7;
  IClient *pIVar8;
  IGraphics *pIVar9;
  long lVar10;
  CNetObj_GameDataRace *pCVar11;
  ITextRender *pIVar12;
  vec2 CursorPosition;
  vec2 Pos;
  vec2 CursorPosition_00;
  vec2 Pos_00;
  int iVar13;
  int iVar14;
  CAnimState *pCVar15;
  CClientData *pCVar16;
  CPlayerInfoItem *pCVar17;
  ulong uVar18;
  long lVar19;
  int64 StringVersion;
  char *pcVar20;
  uint uVar21;
  uint uVar22;
  int t;
  CTextCursor *this_00;
  long lVar23;
  int iVar24;
  int t_1;
  float *pfVar25;
  CTextCursor *pCVar26;
  long in_FS_OFFSET;
  bool bVar27;
  float fVar28;
  float extraout_XMM0_Da;
  float fVar29;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar30;
  float fVar31;
  float fVar32;
  float extraout_XMM0_Da_00;
  float fVar33;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar34;
  float fVar35;
  float fVar36;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar37;
  CUIRect Rect;
  char aBuf [32];
  char aBuf_1 [32];
  CPlayerInfoItem aPlayerInfo [2];
  char aName [64];
  float local_1b8;
  vec4 local_1a8;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_198 [2];
  float local_190;
  undefined4 local_18c;
  vec4 local_188 [2];
  CTeeRenderInfo local_168;
  CUIRect local_c8;
  CNetObj_PlayerInfo *local_b8;
  undefined8 uStack_b0;
  undefined8 local_80;
  char local_78 [32];
  char local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar5 = (this->super_CComponent).m_pClient;
  if ((((pCVar5->m_Snap).m_pGameData)->m_GameStateFlags & 0xc) == 0) {
    uVar3 = (pCVar5->m_GameInfo).m_GameFlags;
    fVar33 = ((float)pCVar5->m_pGraphics->m_ScreenWidth / (float)pCVar5->m_pGraphics->m_ScreenHeight
             ) * 300.0;
    if ((((uVar3 & 1) == 0) || ((uVar3 & 8) != 0)) ||
       ((pCVar5->m_Snap).m_pGameDataTeam == (CNetObj_GameDataTeam *)0x0)) {
      local_80 = 0x200000001;
      local_b8 = (CNetObj_PlayerInfo *)0x0;
      uStack_b0 = 0;
      local_c8.x = 0.0;
      local_c8.y = 0.0;
      local_c8.w = 0.0;
      local_c8.h = 0.0;
      if ((pCVar5->m_Snap).m_aInfoByScore[0].m_pPlayerInfo == (CNetObj_PlayerInfo *)0x0) {
        bVar27 = true;
        uVar22 = 0xffffffff;
        uVar18 = 0;
      }
      else {
        pCVar17 = (pCVar5->m_Snap).m_aInfoByScore;
        uVar22 = 0xffffffff;
        uVar21 = 0;
        uVar18 = 0;
        do {
          pCVar17 = pCVar17 + 1;
          if (pCVar5->m_aClients[pCVar17[-1].m_ClientID].m_Team != -1) {
            fVar28 = *(float *)((long)&pCVar17[-1].m_pPlayerInfo + 4);
            fVar35 = (float)pCVar17[-1].m_ClientID;
            fVar36 = *(float *)&pCVar17[-1].field_0xc;
            (&local_c8)[(int)uVar21].x = *(float *)&pCVar17[-1].m_pPlayerInfo;
            (&local_c8)[(int)uVar21].y = fVar28;
            (&local_c8)[(int)uVar21].w = fVar35;
            (&local_c8)[(int)uVar21].h = fVar36;
            if ((&local_c8)[(int)uVar21].w == (float)pCVar5->m_LocalClientID) {
              uVar22 = uVar21;
            }
            uVar21 = uVar21 + 1;
          }
          bVar27 = uVar18 < 0x3f;
          if ((1 < (int)uVar21) || (0x3e < uVar18)) {
            uVar18 = (ulong)((int)uVar18 + 1);
            break;
          }
          uVar18 = uVar18 + 1;
        } while (pCVar17->m_pPlayerInfo != (CNetObj_PlayerInfo *)0x0);
      }
      if (uVar22 == 0xffffffff) {
        iVar24 = pCVar5->m_LocalClientID;
        uVar22 = 0xffffffff;
        if (((long)iVar24 != -1) && (!(bool)(bVar27 ^ 1U | pCVar5->m_aClients[iVar24].m_Team == -1))
           ) {
          local_80._4_4_ = 2;
          uVar18 = uVar18 & 0xffffffff;
          pCVar17 = (pCVar5->m_Snap).m_aInfoByScore + uVar18;
          lVar19 = 0;
          if (uVar18 < 0x40) {
            lVar19 = 0x3f - uVar18;
          }
          lVar19 = lVar19 + 1;
          do {
            if (pCVar17->m_pPlayerInfo == (CNetObj_PlayerInfo *)0x0) break;
            local_80._4_4_ =
                 local_80._4_4_ + (uint)(pCVar5->m_aClients[pCVar17->m_ClientID].m_Team != -1);
            if (pCVar17->m_ClientID == iVar24) {
              local_80 = CONCAT44(local_80._4_4_,1);
              local_b8 = pCVar17->m_pPlayerInfo;
              uStack_b0 = *(undefined8 *)&pCVar17->m_ClientID;
              uVar22 = 1;
              goto LAB_00145d18;
            }
            pCVar17 = pCVar17 + 1;
            lVar19 = lVar19 + -1;
          } while (lVar19 != 0);
          local_80 = CONCAT44(local_80._4_4_,1);
        }
      }
LAB_00145d18:
      if ((RenderScoreHud()::s_ScoreCursors == '\0') &&
         (iVar24 = __cxa_guard_acquire(&RenderScoreHud()::s_ScoreCursors), iVar24 != 0)) {
        lVar19 = 0;
        do {
          CTextCursor::CTextCursor
                    ((CTextCursor *)((long)&RenderScoreHud::s_ScoreCursors[0].m_Width + lVar19));
          lVar19 = lVar19 + 0x68;
        } while (lVar19 != 0xd0);
        __cxa_atexit(__cxx_global_array_dtor_15,0,&__dso_handle);
        __cxa_guard_release(&RenderScoreHud()::s_ScoreCursors);
      }
      if ((RenderScoreHud()::s_PositionCursors == '\0') &&
         (iVar24 = __cxa_guard_acquire(&RenderScoreHud()::s_PositionCursors), iVar24 != 0)) {
        lVar19 = 0;
        do {
          CTextCursor::CTextCursor
                    ((CTextCursor *)((long)&RenderScoreHud::s_PositionCursors[0].m_Width + lVar19));
          lVar19 = lVar19 + 0x68;
        } while (lVar19 != 0xd0);
        __cxa_atexit(__cxx_global_array_dtor_16,0,&__dso_handle);
        __cxa_guard_release(&RenderScoreHud()::s_PositionCursors);
      }
      uVar2 = *(undefined4 *)(&DAT_001dbae8 + (ulong)((uVar3 & 8) == 0) * 4);
      lVar23 = 0;
      lVar19 = 0;
      do {
        *(undefined4 *)((long)&RenderScoreHud::s_ScoreCursors[0].m_FontSize + lVar19) = uVar2;
        lVar10 = *(long *)(&local_c8.x + lVar23);
        if (lVar10 == 0) {
          local_188[0]._0_8_ = local_188[0]._0_8_ & 0xffffffffffffff00;
          StringVersion = -1;
        }
        else {
          if ((uVar3 & 8) == 0) {
            str_format((char *)local_188,0x20,"%d");
          }
          else {
            pCVar11 = (((this->super_CComponent).m_pClient)->m_Snap).m_pGameDataRace;
            if (pCVar11 == (CNetObj_GameDataRace *)0x0) {
              iVar24 = 3;
            }
            else {
              iVar24 = pCVar11->m_Precision;
            }
            FormatTime((char *)local_188,0x20,*(int *)(lVar10 + 4),iVar24);
          }
          StringVersion = (int64)*(int *)(lVar10 + 4);
        }
        pCVar26 = (CTextCursor *)((long)&RenderScoreHud::s_ScoreCursors[0].m_Width + lVar19);
        CTextCursor::Reset(pCVar26,StringVersion);
        pIVar12 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar12->super_IInterface)._vptr_IInterface[7])(pIVar12,pCVar26,local_188,0xffffffff);
        pCVar26 = (CTextCursor *)((long)&RenderScoreHud::s_PositionCursors[0].m_Width + lVar19);
        CTextCursor::Reset(pCVar26,0);
        str_format((char *)local_188,0x20,"%d.",(ulong)*(uint *)(local_78 + lVar23 + -8));
        *(undefined4 *)((long)&RenderScoreHud::s_PositionCursors[0].m_FontSize + lVar19) =
             0x41200000;
        pIVar12 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar12->super_IInterface)._vptr_IInterface[7])(pIVar12,pCVar26,local_188,0xffffffff);
        lVar19 = lVar19 + 0x68;
        lVar23 = lVar23 + 4;
      } while (lVar19 == 0x68);
      fVar28 = RenderScoreHud::s_ScoreCursors[0].m_Width;
      if (RenderScoreHud::s_ScoreCursors[0].m_Width <= RenderScoreHud::s_ScoreCursors[1].m_Width) {
        fVar28 = RenderScoreHud::s_ScoreCursors[1].m_Width;
      }
      pIVar12 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar12->super_IInterface)._vptr_IInterface[6])(uVar2,pIVar12,"10",0xffffffff);
      if (fVar28 <= extraout_XMM0_Da) {
        fVar28 = extraout_XMM0_Da;
      }
      if ((uVar3 & 4) != 0) {
        if ((RenderScoreHud()::s_PlayerCountCursor == '\0') &&
           (iVar24 = __cxa_guard_acquire(&RenderScoreHud()::s_PlayerCountCursor), iVar24 != 0)) {
          CTextCursor::CTextCursor(&RenderScoreHud::s_PlayerCountCursor,8.0,0);
          __cxa_atexit(CTextCursor::~CTextCursor,&RenderScoreHud::s_PlayerCountCursor,&__dso_handle)
          ;
          __cxa_guard_release(&RenderScoreHud()::s_PlayerCountCursor);
        }
        pcVar20 = "%d players left";
        if ((((this->super_CComponent).m_pClient)->m_Snap).m_AliveCount[0] == 1) {
          pcVar20 = "%d player left";
        }
        pcVar20 = Localize(pcVar20,"");
        str_format((char *)&local_168,0x20,pcVar20,
                   (ulong)(uint)(((this->super_CComponent).m_pClient)->m_Snap).m_AliveCount[0]);
        CTextCursor::Reset(&RenderScoreHud::s_PlayerCountCursor,
                           (long)(g_Localization.m_CurrentVersion << 8 |
                                 (((this->super_CComponent).m_pClient)->m_Snap).m_AliveCount[0]));
        pIVar12 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar12->super_IInterface)._vptr_IInterface[7])
                  (pIVar12,&RenderScoreHud::s_PlayerCountCursor,&local_168,0xffffffff);
        RenderScoreHud::s_PlayerCountCursor.m_CursorPos.field_0.x =
             (fVar33 - RenderScoreHud::s_PlayerCountCursor.m_Width) + -1.0;
        aVar34.x = (fVar33 - fVar28) + -16.0 + -6.0;
        if (aVar34.x <= RenderScoreHud::s_PlayerCountCursor.m_CursorPos.field_0.x) {
          RenderScoreHud::s_PlayerCountCursor.m_CursorPos.field_0.x = aVar34.x;
        }
        RenderScoreHud::s_PlayerCountCursor.m_CursorPos.field_1.y = 217.0;
        pIVar12 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar12->super_IInterface)._vptr_IInterface[0x10])
                  (0x3f800000,pIVar12,&RenderScoreHud::s_PlayerCountCursor,0,0xffffffff);
      }
      fVar35 = fVar33 - fVar28;
      local_1b8 = 0.0;
      if ((uVar3 & 8) != 0) {
        local_1b8 = 2.0;
      }
      aVar34.x = fVar35 + -16.0 + -6.0 + -16.0;
      pfVar25 = &local_c8.w;
      fVar36 = 229.0;
      iVar24 = 1;
      lVar19 = 0;
      do {
        fVar29 = (float)(iVar24 + -1);
        aVar30.x = fVar29 * 20.0 + fVar36;
        local_18c = 0x41900000;
        local_198[0].x = aVar34.x;
        local_198[1].x = aVar30.x;
        local_190 = fVar28 + 16.0 + 6.0 + 16.0;
        (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])
                  ();
        if ((ulong)uVar22 * 0x68 == lVar19) {
          local_168.m_aTextures[0].m_Id = 0x3f800000;
          local_168.m_aTextures[1].m_Id = 0x3f800000;
          local_168.m_aTextures[2].m_Id = 0x3f800000;
        }
        else {
          local_168.m_aTextures[0].m_Id = 0;
          local_168.m_aTextures[1].m_Id = 0;
          local_168.m_aTextures[2].m_Id = 0;
        }
        local_168.m_aTextures[3].m_Id = 0x3e800000;
        CUIRect::Draw((CUIRect *)local_198,(vec4 *)&local_168,5.0,5);
        *(ulong *)((long)&RenderScoreHud::s_ScoreCursors[0].m_CursorPos.field_0 + lVar19) =
             CONCAT44(aVar30.x + local_1b8,
                      (fVar28 - *(float *)((long)&RenderScoreHud::s_ScoreCursors[0].m_Width + lVar19
                                          )) * 0.5 + fVar35 + -3.0);
        pIVar12 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar12->super_IInterface)._vptr_IInterface[0x10])
                  (0x3f800000,pIVar12,(long)&RenderScoreHud::s_ScoreCursors[0].m_Width + lVar19,0,
                   0xffffffff);
        lVar23._0_4_ = ((CUIRect *)(pfVar25 + -2))->x;
        lVar23._4_4_ = ((CUIRect *)(pfVar25 + -2))->y;
        if (lVar23 != 0) {
          if ((RenderScoreHud()::s_NameCursor == '\0') &&
             (iVar14 = __cxa_guard_acquire(&RenderScoreHud()::s_NameCursor), iVar14 != 0)) {
            CTextCursor::CTextCursor(&RenderScoreHud::s_NameCursor,8.0,0);
            __cxa_atexit(CTextCursor::~CTextCursor,&RenderScoreHud::s_NameCursor,&__dso_handle);
            __cxa_guard_release(&RenderScoreHud()::s_NameCursor);
          }
          CTextCursor::Reset(&RenderScoreHud::s_NameCursor,-1);
          ID = *pfVar25;
          pCVar5 = (this->super_CComponent).m_pClient;
          pCVar16 = pCVar5->m_aClients + (int)ID;
          if (pCVar5->m_pConfig->m_ClShowsocial == 0) {
            pCVar16 = (CClientData *)0x1e33dc;
          }
          str_format(local_78,0x40,"%s",pCVar16);
          pIVar12 = ((this->super_CComponent).m_pClient)->m_pTextRender;
          (*(pIVar12->super_IInterface)._vptr_IInterface[7])
                    (pIVar12,&RenderScoreHud::s_NameCursor,local_78,0xffffffff);
          fVar32 = RenderScoreHud::s_NameCursor.m_Width;
          fVar31 = CUI::GetClientIDRectWidth(&((this->super_CComponent).m_pClient)->m_UI,8.0);
          aVar30.x = (fVar33 - (fVar31 + fVar32)) + -1.0;
          if (aVar34.x <= aVar30.x) {
            aVar30.x = aVar34.x;
          }
          aVar37.y = (float)iVar24 * 20.0 + fVar36 + -3.0;
          local_168.m_aTextures[0].m_Id = 0x3f800000;
          local_168.m_aTextures[1].m_Id = 0x3f800000;
          local_168.m_aTextures[2].m_Id = 0x3f800000;
          local_168.m_aTextures[3].m_Id = 0x3f000000;
          local_1a8.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3dcccccd;
          local_1a8.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3dcccccd;
          local_1a8.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3dcccccd;
          local_1a8.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
          CursorPosition_00.field_1 = aVar37;
          CursorPosition_00.field_0.x = aVar30.x;
          fVar32 = CUI::DrawClientID(&((this->super_CComponent).m_pClient)->m_UI,
                                     RenderScoreHud::s_NameCursor.m_FontSize,CursorPosition_00,
                                     (int)ID,(vec4 *)&local_168,&local_1a8);
          RenderScoreHud::s_NameCursor.m_CursorPos.field_0.x = fVar32 + aVar30.x;
          pIVar12 = ((this->super_CComponent).m_pClient)->m_pTextRender;
          RenderScoreHud::s_NameCursor.m_CursorPos.field_1.y = aVar37.y;
          (*(pIVar12->super_IInterface)._vptr_IInterface[0x10])
                    (0x3f800000,pIVar12,&RenderScoreHud::s_NameCursor,0);
          pCVar5 = (this->super_CComponent).m_pClient;
          memcpy(&local_168,&pCVar5->m_aClients[(int)ID].m_RenderInfo,0x9c);
          local_168.m_Size = 18.0;
          pCVar15 = CAnimState::GetIdle();
          Pos_00.field_1.y = fVar29 * 20.0 + fVar36 + 1.0 + local_168.m_Size * 0.5;
          Pos_00.field_0.x = (fVar35 - local_168.m_Size * 0.5) + -3.0;
          CRenderTools::RenderTee
                    (&pCVar5->m_RenderTools,pCVar15,&local_168,0,(vec2)0x3f800000,Pos_00);
        }
        *(float *)((long)&RenderScoreHud::s_PositionCursors[0].m_CursorPos.field_0 + lVar19) =
             fVar35 + -16.0 + -3.0 + -16.0;
        *(float *)((long)&RenderScoreHud::s_PositionCursors[0].m_CursorPos.field_1 + lVar19) =
             fVar29 * 20.0 + fVar36 + 2.0;
        pIVar12 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar12->super_IInterface)._vptr_IInterface[0x10])
                  (0x3f800000,pIVar12,(long)&RenderScoreHud::s_PositionCursors[0].m_Width + lVar19,0
                   ,0xffffffff);
        fVar36 = fVar36 + 8.0;
        iVar24 = iVar24 + 1;
        lVar19 = lVar19 + 0x68;
        pfVar25 = pfVar25 + 4;
      } while (lVar19 == 0x68);
    }
    else {
      if ((RenderScoreHud()::s_ExpectedScoreWidth == '\0') &&
         (iVar24 = __cxa_guard_acquire(&RenderScoreHud()::s_ExpectedScoreWidth), iVar24 != 0)) {
        pIVar12 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar12->super_IInterface)._vptr_IInterface[6])(0x41600000,pIVar12,"100",0xffffffff);
        RenderScoreHud::s_ExpectedScoreWidth = extraout_XMM0_Da_00;
        __cxa_guard_release(&RenderScoreHud()::s_ExpectedScoreWidth);
      }
      if ((RenderScoreHud()::s_TeamscoreCursors == '\0') &&
         (iVar24 = __cxa_guard_acquire(&RenderScoreHud()::s_TeamscoreCursors), iVar24 != 0)) {
        lVar19 = 0;
        do {
          CTextCursor::CTextCursor
                    ((CTextCursor *)((long)&RenderScoreHud::s_TeamscoreCursors[0].m_Width + lVar19))
          ;
          lVar19 = lVar19 + 0x68;
        } while (lVar19 != 0xd0);
        __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
        __cxa_guard_release(&RenderScoreHud()::s_TeamscoreCursors);
      }
      if ((RenderScoreHud()::s_PlayerCountCursors == '\0') &&
         (iVar24 = __cxa_guard_acquire(&RenderScoreHud()::s_PlayerCountCursors), iVar24 != 0)) {
        lVar19 = 0;
        do {
          CTextCursor::CTextCursor
                    ((CTextCursor *)
                     ((long)&RenderScoreHud::s_PlayerCountCursors[0].m_Width + lVar19));
          lVar19 = lVar19 + 0x68;
        } while (lVar19 != 0xd0);
        __cxa_atexit(__cxx_global_array_dtor_11,0,&__dso_handle);
        __cxa_guard_release(&RenderScoreHud()::s_PlayerCountCursors);
      }
      paVar6 = (anon_union_4_2_94730284_for_vector2_base<float>_1 *)
               (((this->super_CComponent).m_pClient)->m_Snap).m_pGameDataTeam;
      local_198[0] = *paVar6;
      aVar34 = paVar6[1];
      lVar19 = 0;
      pcVar20 = local_78;
      local_198[1] = aVar34;
      str_format(pcVar20,0x20,"%d");
      str_format(local_58,0x20,"%d",(ulong)(uint)aVar34);
      pCVar26 = RenderScoreHud::s_TeamscoreCursors;
      do {
        pCVar26->m_FontSize = 14.0;
        CTextCursor::Reset(pCVar26,(long)(int)local_198[lVar19]);
        pIVar12 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar12->super_IInterface)._vptr_IInterface[7])(pIVar12,pCVar26,pcVar20,0xffffffff);
        lVar19 = lVar19 + 1;
        pcVar20 = pcVar20 + 0x20;
        pCVar26 = pCVar26 + 1;
      } while (lVar19 == 1);
      pCVar26 = RenderScoreHud::s_TeamscoreCursors;
      fVar28 = RenderScoreHud::s_TeamscoreCursors[0].m_Width;
      if (RenderScoreHud::s_TeamscoreCursors[0].m_Width <=
          RenderScoreHud::s_TeamscoreCursors[1].m_Width) {
        fVar28 = RenderScoreHud::s_TeamscoreCursors[1].m_Width;
      }
      if (fVar28 <= RenderScoreHud::s_ExpectedScoreWidth) {
        fVar28 = RenderScoreHud::s_ExpectedScoreWidth;
      }
      CVar1.m_Id = *(int *)(&DAT_001dbae0 + (ulong)((uVar3 & 2) == 0) * 4);
      fVar35 = fVar33 - fVar28;
      aVar34.x = (fVar35 - CVar1.m_Id) + -6.0;
      fVar36 = 229.0;
      this_00 = RenderScoreHud::s_PlayerCountCursors;
      lVar19 = 0;
      do {
        fVar29 = (float)(int)lVar19 * 20.0 + fVar36;
        local_c8.y = fVar29;
        local_c8.x = aVar34.x;
        local_c8.h = 18.0;
        local_c8.w = (float)CVar1.m_Id + fVar28 + 6.0;
        (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])
                  ();
        if (lVar19 == 0) {
          local_168.m_aTextures[0].m_Id = 0x3f800000;
          local_168.m_aTextures[1].m_Id = 0;
          local_168.m_aTextures[2].m_Id = 0;
        }
        else {
          local_168.m_aTextures[0].m_Id = 0;
          local_168.m_aTextures[1].m_Id = 0;
          local_168.m_aTextures[2].m_Id = 0x3f800000;
        }
        local_168.m_aTextures[3].m_Id = 0x3e800000;
        CUIRect::Draw(&local_c8,(vec4 *)&local_168,5.0,5);
        (pCVar26->m_CursorPos).field_0.x = (fVar28 - pCVar26->m_Width) * 0.5 + fVar35 + -3.0;
        (pCVar26->m_CursorPos).field_1.y = fVar29;
        pIVar12 = ((this->super_CComponent).m_pClient)->m_pTextRender;
        (*(pIVar12->super_IInterface)._vptr_IInterface[0x10])
                  (0x3f800000,pIVar12,pCVar26,0,0xffffffff);
        if ((uVar3 & 4) != 0) {
          this_00->m_FontSize = 8.0;
          pcVar20 = "%d player left";
          if ((((this->super_CComponent).m_pClient)->m_Snap).m_AliveCount[lVar19] != 1) {
            pcVar20 = "%d players left";
          }
          pcVar20 = Localize(pcVar20,"");
          str_format((char *)&local_168,0x20,pcVar20,
                     (ulong)(uint)(((this->super_CComponent).m_pClient)->m_Snap).m_AliveCount
                                  [lVar19]);
          CTextCursor::Reset(this_00,(long)(g_Localization.m_CurrentVersion << 8 |
                                           (((this->super_CComponent).m_pClient)->m_Snap).
                                           m_AliveCount[lVar19]));
          pIVar12 = ((this->super_CComponent).m_pClient)->m_pTextRender;
          (*(pIVar12->super_IInterface)._vptr_IInterface[7])(pIVar12,this_00,&local_168,0xffffffff);
          aVar30.x = (fVar33 - this_00->m_Width) + -1.0;
          if (aVar34.x <= aVar30.x) {
            aVar30.x = aVar34.x;
          }
          (this_00->m_CursorPos).field_0.x = (float)aVar30;
          (this_00->m_CursorPos).field_1.y = (float)((int)lVar19 + 1) * 20.0 + fVar36 + -3.0;
          pIVar12 = ((this->super_CComponent).m_pClient)->m_pTextRender;
          (*(pIVar12->super_IInterface)._vptr_IInterface[0x10])
                    (0x3f800000,pIVar12,this_00,0,0xffffffff);
        }
        fVar36 = fVar36 + 8.0;
        lVar19 = lVar19 + 1;
        this_00 = this_00 + 1;
        pCVar26 = pCVar26 + 1;
      } while (lVar19 == 1);
      if (((uVar3 & 2) != 0) &&
         (pCVar7 = (((this->super_CComponent).m_pClient)->m_Snap).m_pGameDataFlag,
         pCVar7 != (CNetObj_GameDataFlag *)0x0)) {
        local_1a8.field_0 =
             (anon_union_4_2_94730227_for_vector4_base<float>_1)pCVar7->m_FlagCarrierRed;
        local_1a8.field_1 =
             (anon_union_4_2_947300d3_for_vector4_base<float>_3)pCVar7->m_FlagCarrierBlue;
        local_80._0_4_ = pCVar7->m_FlagDropTickRed;
        local_80._4_4_ = pCVar7->m_FlagDropTickBlue;
        fVar28 = 229.0;
        lVar19 = 0;
        do {
          uVar3 = *(uint *)(local_78 + lVar19 * 4 + -8);
          uVar18 = (ulong)uVar3;
          iVar24 = 0x14;
          if (uVar3 != 0) {
            pIVar8 = ((this->super_CComponent).m_pClient)->m_pClient;
            iVar13 = pIVar8->m_CurGameTick - uVar3;
            iVar14 = pIVar8->m_GameTickSpeed;
            uVar18 = (long)iVar13 % (long)iVar14 & 0xffffffff;
            iVar24 = 0x14;
            if (0x18 < iVar13 / iVar14) {
              iVar24 = 10;
            }
          }
          aVar4 = (&local_1a8.field_0)[lVar19];
          iVar14 = (int)lVar19;
          if ((aVar4 == (anon_union_4_2_94730227_for_vector4_base<float>_1)0xfffffffe) ||
             ((aVar4 == (anon_union_4_2_94730227_for_vector4_base<float>_1)0xffffffff &&
              (lVar23 = (long)((this->super_CComponent).m_pClient)->m_pClient->m_CurGameTick,
              uVar18 = lVar23 % (long)iVar24 & 0xffffffff, (lVar23 / (long)iVar24 & 1U) != 0)))) {
            pIVar9 = ((this->super_CComponent).m_pClient)->m_pGraphics;
            (*(pIVar9->super_IInterface)._vptr_IInterface[8])(pIVar9,(ulong)(uint)aVar4,uVar18);
            pIVar9 = ((this->super_CComponent).m_pClient)->m_pGraphics;
            (*(pIVar9->super_IInterface)._vptr_IInterface[0x13])
                      (pIVar9,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
            (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface
              [0x17])();
            CRenderTools::SelectSprite
                      (&((this->super_CComponent).m_pClient)->m_RenderTools,(lVar19 == 0) + 0x3f,0,0
                       ,0);
            local_168.m_aTextures[1].m_Id = (int)((float)iVar14 * 20.0 + fVar28 + 1.0);
            local_168.m_aTextures[0].m_Id = (int)(fVar35 - CVar1.m_Id);
            local_168.m_aTextures[3].m_Id = CVar1.m_Id;
            local_168.m_aTextures[2].m_Id = (int)(CVar1.m_Id * 0.5);
            pIVar9 = ((this->super_CComponent).m_pClient)->m_pGraphics;
            (*(pIVar9->super_IInterface)._vptr_IInterface[0x1d])(pIVar9,&local_168,1);
            (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface
              [0x18])();
          }
          else if (-1 < (int)aVar4) {
            if ((RenderScoreHud()::s_CarrierCursor == '\0') &&
               (iVar24 = __cxa_guard_acquire(&RenderScoreHud()::s_CarrierCursor), iVar24 != 0)) {
              CTextCursor::CTextCursor(&RenderScoreHud::s_CarrierCursor,8.0,0);
              __cxa_atexit(CTextCursor::~CTextCursor,&RenderScoreHud::s_CarrierCursor,&__dso_handle)
              ;
              __cxa_guard_release(&RenderScoreHud()::s_CarrierCursor);
            }
            CTextCursor::Reset(&RenderScoreHud::s_CarrierCursor,-1);
            iVar24 = (int)(&local_1a8.field_0)[lVar19] % 0x40;
            pCVar5 = (this->super_CComponent).m_pClient;
            pCVar16 = pCVar5->m_aClients + iVar24;
            if (pCVar5->m_pConfig->m_ClShowsocial == 0) {
              pCVar16 = (CClientData *)0x1e33dc;
            }
            str_format((char *)&local_c8,0x40,"%s",pCVar16);
            pIVar12 = ((this->super_CComponent).m_pClient)->m_pTextRender;
            (*(pIVar12->super_IInterface)._vptr_IInterface[7])
                      (pIVar12,&RenderScoreHud::s_CarrierCursor,&local_c8,0xffffffff);
            fVar36 = RenderScoreHud::s_CarrierCursor.m_Width;
            fVar29 = CUI::GetClientIDRectWidth(&((this->super_CComponent).m_pClient)->m_UI,8.0);
            aVar30.x = (fVar33 - (fVar29 + fVar36)) + -1.0;
            if (aVar34.x <= aVar30.x) {
              aVar30.x = aVar34.x;
            }
            aVar37.y = (float)(iVar14 + 1) * 20.0 + fVar28 + -3.0;
            local_168.m_aTextures[0].m_Id = 0x3f800000;
            local_168.m_aTextures[1].m_Id = 0x3f800000;
            local_168.m_aTextures[2].m_Id = 0x3f800000;
            local_168.m_aTextures[3].m_Id = 0x3f000000;
            local_188[0].field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3dcccccd;
            local_188[0].field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3dcccccd;
            local_188[0].field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3dcccccd;
            local_188[0].field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
            CursorPosition.field_1 = aVar37;
            CursorPosition.field_0.x = aVar30.x;
            fVar36 = CUI::DrawClientID(&((this->super_CComponent).m_pClient)->m_UI,
                                       RenderScoreHud::s_CarrierCursor.m_FontSize,CursorPosition,
                                       iVar24,(vec4 *)&local_168,local_188);
            RenderScoreHud::s_CarrierCursor.m_CursorPos.field_0.x = fVar36 + aVar30.x;
            pIVar12 = ((this->super_CComponent).m_pClient)->m_pTextRender;
            RenderScoreHud::s_CarrierCursor.m_CursorPos.field_1.y = aVar37.y;
            (*(pIVar12->super_IInterface)._vptr_IInterface[0x10])
                      (0x3f800000,pIVar12,&RenderScoreHud::s_CarrierCursor,0);
            pCVar5 = (this->super_CComponent).m_pClient;
            memcpy(&local_168,&pCVar5->m_aClients[iVar24].m_RenderInfo,0x9c);
            local_168.m_Size = 18.0;
            pCVar15 = CAnimState::GetIdle();
            Pos.field_1.y = (float)iVar14 * 20.0 + fVar28 + 1.0 + local_168.m_Size * 0.5;
            Pos.field_0.x = (fVar35 - local_168.m_Size * 0.5) + -3.0;
            CRenderTools::RenderTee
                      (&pCVar5->m_RenderTools,pCVar15,&local_168,0,(vec2)0x3f800000,Pos);
          }
          fVar28 = fVar28 + 8.0;
          lVar19 = lVar19 + 1;
        } while (lVar19 == 1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderScoreHud()
{
	// render small score hud
	if(!(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&(GAMESTATEFLAG_ROUNDOVER|GAMESTATEFLAG_GAMEOVER)))
	{
		int GameFlags = m_pClient->m_GameInfo.m_GameFlags;
		float Whole = 300*Graphics()->ScreenAspect();
		float StartY = 229.0f;
		const float TeamOffset = 20.0f;

		if(GameFlags&GAMEFLAG_TEAMS && m_pClient->m_Snap.m_pGameDataTeam && !(GameFlags&GAMEFLAG_RACE))
		{
			static float s_ExpectedScoreWidth = TextRender()->TextWidth(14.0f, "100", -1);
			static CTextCursor s_TeamscoreCursors[2];
			static CTextCursor s_PlayerCountCursors[2];
		
			char aScoreTeam[2][32];
			int Teamscores[2];
			Teamscores[0] = m_pClient->m_Snap.m_pGameDataTeam->m_TeamscoreRed;
			Teamscores[1] = m_pClient->m_Snap.m_pGameDataTeam->m_TeamscoreBlue;
			str_format(aScoreTeam[TEAM_RED], sizeof(aScoreTeam)/2, "%d", Teamscores[TEAM_RED]);
			str_format(aScoreTeam[TEAM_BLUE], sizeof(aScoreTeam)/2, "%d", Teamscores[TEAM_BLUE]);
			
			for(int t = 0; t < NUM_TEAMS; t++)
			{
				s_TeamscoreCursors[t].m_FontSize = 14.0f;
				s_TeamscoreCursors[t].Reset(Teamscores[t]);
				TextRender()->TextDeferred(&s_TeamscoreCursors[t], aScoreTeam[t], -1);
			}

			float ScoreWidthMax = maximum(maximum(s_TeamscoreCursors[0].Width(), s_TeamscoreCursors[1].Width()), s_ExpectedScoreWidth);
			float Split = 3.0f;
			float ImageSize = GameFlags&GAMEFLAG_FLAGS ? 16.0f : Split;

			for(int t = 0; t < NUM_TEAMS; t++)
			{
				// draw box
				CUIRect Rect = {Whole-ScoreWidthMax-ImageSize-2*Split, StartY+t*TeamOffset, ScoreWidthMax+ImageSize+2*Split, 18.0f};
				Graphics()->BlendNormal();
				Rect.Draw(t == 0 ? vec4(1.0f, 0.0f, 0.0f, 0.25f) : vec4(0.0f, 0.0f, 1.0f, 0.25f), 5.0f, CUIRect::CORNER_L);

				// draw score
				s_TeamscoreCursors[t].MoveTo(Whole-ScoreWidthMax+(ScoreWidthMax-s_TeamscoreCursors[t].Width())/2-Split, StartY+t*TeamOffset);
				TextRender()->DrawTextOutlined(&s_TeamscoreCursors[t]);

				if(GameFlags&GAMEFLAG_SURVIVAL)
				{
					s_PlayerCountCursors[t].m_FontSize = 8.0f;
					char aBuf[32];
					str_format(aBuf, sizeof(aBuf), m_pClient->m_Snap.m_AliveCount[t]==1 ? Localize("%d player left") : Localize("%d players left"),
								m_pClient->m_Snap.m_AliveCount[t]);

					s_PlayerCountCursors[t].Reset(g_Localization.Version() << 8 | m_pClient->m_Snap.m_AliveCount[t]);
					TextRender()->TextDeferred(&s_PlayerCountCursors[t], aBuf, -1);
					s_PlayerCountCursors[t].MoveTo(minimum(Whole-s_PlayerCountCursors[t].Width()-1.0f, Whole-ScoreWidthMax-ImageSize-2*Split), StartY+(t+1)*TeamOffset-3.0f);
					TextRender()->DrawTextOutlined(&s_PlayerCountCursors[t]);
				}
				StartY += 8.0f;
			}

			if(GameFlags&GAMEFLAG_FLAGS && m_pClient->m_Snap.m_pGameDataFlag)
			{
				int FlagCarrier[2] = { m_pClient->m_Snap.m_pGameDataFlag->m_FlagCarrierRed, m_pClient->m_Snap.m_pGameDataFlag->m_FlagCarrierBlue };
				int FlagDropTick[2] = { m_pClient->m_Snap.m_pGameDataFlag->m_FlagDropTickRed, m_pClient->m_Snap.m_pGameDataFlag->m_FlagDropTickBlue };
				StartY = 229.0f;

				for(int t = 0; t < 2; t++)
				{
					int BlinkTimer = (FlagDropTick[t] != 0 && (Client()->GameTick()-FlagDropTick[t])/Client()->GameTickSpeed() >= 25) ? 10 : 20;
					if(FlagCarrier[t] == FLAG_ATSTAND || (FlagCarrier[t] == FLAG_TAKEN && ((Client()->GameTick()/BlinkTimer)&1)))
					{
						// draw flag
						Graphics()->BlendNormal();
						Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
						Graphics()->QuadsBegin();
						RenderTools()->SelectSprite(t==0?SPRITE_FLAG_RED:SPRITE_FLAG_BLUE);
						IGraphics::CQuadItem QuadItem(Whole-ScoreWidthMax-ImageSize, StartY+1.0f+t*TeamOffset, ImageSize/2, ImageSize);
						Graphics()->QuadsDrawTL(&QuadItem, 1);
						Graphics()->QuadsEnd();
					}
					else if(FlagCarrier[t] >= 0)
					{
						// draw name
						static CTextCursor s_CarrierCursor(8.0f);
						s_CarrierCursor.Reset();

						int ID = FlagCarrier[t]%MAX_CLIENTS;
						char aName[64];
						str_format(aName, sizeof(aName), "%s", Config()->m_ClShowsocial ? m_pClient->m_aClients[ID].m_aName : "");

						TextRender()->TextDeferred(&s_CarrierCursor, aName, -1);

						float w = s_CarrierCursor.Width() + UI()->GetClientIDRectWidth(8.0f);
						float x = minimum(Whole-w-1.0f, Whole-ScoreWidthMax-ImageSize-2*Split);
						float y = StartY+(t+1)*TeamOffset-3.0f;
						
						float AdvanceID = UI()->DrawClientID(s_CarrierCursor.m_FontSize, vec2(x, y), ID);
						s_CarrierCursor.MoveTo(x + AdvanceID, y);
						TextRender()->DrawTextOutlined(&s_CarrierCursor);

						// draw tee of the flag holder
						CTeeRenderInfo Info = m_pClient->m_aClients[ID].m_RenderInfo;
						Info.m_Size = 18.0f;
						RenderTools()->RenderTee(CAnimState::GetIdle(), &Info, EMOTE_NORMAL, vec2(1,0),
							vec2(Whole-ScoreWidthMax-Info.m_Size/2-Split, StartY+1.0f+Info.m_Size/2+t*TeamOffset));
					}
					StartY += 8.0f;
				}
			}
		}
		else
		{
			int Local = -1;
			int aPos[2] = { 1, 2 };
			CGameClient::CPlayerInfoItem aPlayerInfo[2] = {{0}};
			int i = 0;
			for(int t = 0; t < 2 && i < MAX_CLIENTS && m_pClient->m_Snap.m_aInfoByScore[i].m_pPlayerInfo; ++i)
			{
				if(m_pClient->m_aClients[m_pClient->m_Snap.m_aInfoByScore[i].m_ClientID].m_Team != TEAM_SPECTATORS)
				{
					aPlayerInfo[t] = m_pClient->m_Snap.m_aInfoByScore[i];
					if(aPlayerInfo[t].m_ClientID == m_pClient->m_LocalClientID)
						Local = t;
					++t;
				}
			}
			// search local player info if not a spectator, nor within top2 scores
			if(Local == -1 && m_pClient->m_LocalClientID != -1 && m_pClient->m_aClients[m_pClient->m_LocalClientID].m_Team != TEAM_SPECTATORS)
			{
				for(; i < MAX_CLIENTS && m_pClient->m_Snap.m_aInfoByScore[i].m_pPlayerInfo; ++i)
				{
					if(m_pClient->m_aClients[m_pClient->m_Snap.m_aInfoByScore[i].m_ClientID].m_Team != TEAM_SPECTATORS)
						++aPos[1];
					if(m_pClient->m_Snap.m_aInfoByScore[i].m_ClientID == m_pClient->m_LocalClientID)
					{
						aPlayerInfo[1] = m_pClient->m_Snap.m_aInfoByScore[i];
						Local = 1;
						break;
					}
				}
			}

			float FontSize = (GameFlags&GAMEFLAG_RACE) ? 10.f : 14.f;
			static CTextCursor s_ScoreCursors[2];
			static CTextCursor s_PositionCursors[2];
			char aBuf[32];
			for(int t = 0; t < 2; ++t)
			{
				s_ScoreCursors[t].m_FontSize = FontSize;
				if(aPlayerInfo[t].m_pPlayerInfo)
				{
					if(GameFlags&GAMEFLAG_RACE)
						FormatTime(aBuf, sizeof(aBuf), aPlayerInfo[t].m_pPlayerInfo->m_Score, m_pClient->RacePrecision());
					else
						str_format(aBuf, sizeof(aBuf), "%d", aPlayerInfo[t].m_pPlayerInfo->m_Score);
					s_ScoreCursors[t].Reset(aPlayerInfo[t].m_pPlayerInfo->m_Score);
				}
				else
				{
					aBuf[0] = 0;
					s_ScoreCursors[t].Reset();
				}

				TextRender()->TextDeferred(&s_ScoreCursors[t], aBuf, -1);

				s_PositionCursors[t].Reset(0);
				str_format(aBuf, sizeof(aBuf), "%d.", aPos[t]);
				s_PositionCursors[t].m_FontSize = 10.0f;
				TextRender()->TextDeferred(&s_PositionCursors[t], aBuf, -1);
			}

			float ScoreWidthMax = maximum(maximum(s_ScoreCursors[0].Width(), s_ScoreCursors[1].Width()), TextRender()->TextWidth(FontSize, "10", -1));
			float Split = 3.0f, ImageSize = 16.0f, PosSize = 16.0f;

			if(GameFlags&GAMEFLAG_SURVIVAL)
			{
				// draw number of alive players
				static CTextCursor s_PlayerCountCursor(8.0f);
				char aBuf[32];
				str_format(aBuf, sizeof(aBuf), m_pClient->m_Snap.m_AliveCount[0] == 1 ? Localize("%d player left") : Localize("%d players left"),
					m_pClient->m_Snap.m_AliveCount[0]);
				s_PlayerCountCursor.Reset(g_Localization.Version() << 8 | m_pClient->m_Snap.m_AliveCount[0]);
				TextRender()->TextDeferred(&s_PlayerCountCursor, aBuf, -1);
				float w = s_PlayerCountCursor.Width();
				s_PlayerCountCursor.MoveTo(minimum(Whole - w - 1.0f, Whole - ScoreWidthMax - ImageSize - 2 * Split), StartY - 12.0f);
				TextRender()->DrawTextOutlined(&s_PlayerCountCursor);
			}

			for(int t = 0; t < 2; t++)
			{
				// draw box
				CUIRect Rect = {Whole-ScoreWidthMax-ImageSize-2*Split-PosSize, StartY+t*TeamOffset, ScoreWidthMax+ImageSize+2*Split+PosSize, 18.0f};
				Graphics()->BlendNormal();
				Rect.Draw(t == Local ? vec4(1.0f, 1.0f, 1.0f, 0.25f) : vec4(0.0f, 0.0f, 0.0f, 0.25f), 5.0f, CUIRect::CORNER_L);

				// draw score
				float Spacing = (GameFlags&GAMEFLAG_RACE) ? 2.f : 0.f;
				s_ScoreCursors[t].MoveTo(Whole-ScoreWidthMax+(ScoreWidthMax-s_ScoreCursors[t].Width())/2-Split, StartY+t*TeamOffset+Spacing);
				TextRender()->DrawTextOutlined(&s_ScoreCursors[t]);

				if(aPlayerInfo[t].m_pPlayerInfo)
				{
					// draw name
					static CTextCursor s_NameCursor(8.0f);
					s_NameCursor.Reset();

					int ID = aPlayerInfo[t].m_ClientID;
					char aName[64];
					str_format(aName, sizeof(aName), "%s", Config()->m_ClShowsocial ? m_pClient->m_aClients[ID].m_aName : "");

					TextRender()->TextDeferred(&s_NameCursor, aName, -1);

					float w = s_NameCursor.Width() + UI()->GetClientIDRectWidth(8.0f);
					float x = minimum(Whole-w-1.0f, Whole-ScoreWidthMax-ImageSize-2*Split-PosSize);
					float y = StartY+(t+1)*TeamOffset-3.0f;

					float AdvanceID = UI()->DrawClientID(s_NameCursor.m_FontSize, vec2(x, y), ID);
					s_NameCursor.MoveTo(x + AdvanceID, y);
					TextRender()->DrawTextOutlined(&s_NameCursor);

					// draw tee
					CTeeRenderInfo Info = m_pClient->m_aClients[ID].m_RenderInfo;
					Info.m_Size = 18.0f;
					RenderTools()->RenderTee(CAnimState::GetIdle(), &Info, EMOTE_NORMAL, vec2(1,0),
						vec2(Whole-ScoreWidthMax-Info.m_Size/2-Split, StartY+1.0f+Info.m_Size/2+t*TeamOffset));
				}

				// draw position
				s_PositionCursors[t].MoveTo(Whole-ScoreWidthMax-ImageSize-Split-PosSize, StartY+2.0f+t*TeamOffset);
				TextRender()->DrawTextOutlined(&s_PositionCursors[t]);

				StartY += 8.0f;
			}
		}
	}
}